

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O0

int scope_stack_pop(scope sp)

{
  int iVar1;
  size_t *psVar2;
  long in_RDI;
  scope_stack_ptr *return_ptr;
  int local_4;
  
  if (in_RDI == 0) {
    log_write_impl_va("metacall",0x24e,"scope_stack_pop",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                      ,3,"Scope stack pop invalid parameters");
    local_4 = 1;
  }
  else {
    psVar2 = scope_stack_return(sp);
    iVar1 = vector_resize(*(undefined8 *)(in_RDI + 0x10),*psVar2);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      log_write_impl_va("metacall",0x246,"scope_stack_pop",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                        ,3,"Scope bad call stack size decrease");
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int scope_stack_pop(scope sp)
{
	if (sp != NULL)
	{
		scope_stack_ptr *return_ptr = scope_stack_return(sp);

		if (vector_resize(sp->call_stack, *return_ptr) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Scope bad call stack size decrease");

			return 1;
		}

		return 0;
	}

	log_write("metacall", LOG_LEVEL_ERROR, "Scope stack pop invalid parameters");

	return 1;
}